

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_perform_upgrade_tls(connectdata *conn)

{
  pop3_conn *pop3c;
  CURLcode result;
  connectdata *conn_local;
  
  pop3c._4_4_ = Curl_ssl_connect_nonblocking(conn,0,&(conn->proto).imapc.ssldone);
  if (pop3c._4_4_ == CURLE_OK) {
    if ((conn->proto).imapc.state != IMAP_UPGRADETLS) {
      state(conn,POP3_UPGRADETLS);
    }
    if (((conn->proto).imapc.ssldone & 1U) != 0) {
      pop3_to_pop3s(conn);
      pop3c._4_4_ = pop3_perform_capa(conn);
    }
  }
  return pop3c._4_4_;
}

Assistant:

static CURLcode pop3_perform_upgrade_tls(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;

  /* Start the SSL connection */
  result = Curl_ssl_connect_nonblocking(conn, FIRSTSOCKET, &pop3c->ssldone);

  if(!result) {
    if(pop3c->state != POP3_UPGRADETLS)
      state(conn, POP3_UPGRADETLS);

    if(pop3c->ssldone) {
      pop3_to_pop3s(conn);
      result = pop3_perform_capa(conn);
    }
  }

  return result;
}